

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::yuv420sp2rgb_nv12(uchar *yuv420sp,int w,int h,uchar *rgb)

{
  int *piVar1;
  undefined1 *in_RCX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int y11;
  int y10;
  int y01;
  int y00;
  int buv;
  int guv;
  int ruv;
  int v;
  int u;
  int remain;
  uchar *rgb1;
  uchar *rgb0;
  uchar *yptr1;
  uchar *yptr0;
  int y;
  uchar *uvptr;
  uchar *yptr;
  int local_108 [3];
  int local_fc [3];
  int local_f0 [3];
  int local_e4;
  int local_e0 [3];
  int local_d4 [3];
  int local_c8 [3];
  int local_bc;
  int local_b8 [3];
  int local_ac [3];
  int local_a0 [3];
  int local_94;
  int local_90 [3];
  int local_84 [3];
  int local_78 [3];
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  byte *local_40;
  byte *local_38;
  int local_2c;
  byte *local_28;
  byte *local_20;
  undefined1 *local_18;
  int local_10;
  int local_c;
  
  local_28 = in_RDI + in_ESI * in_EDX;
  local_20 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  for (local_2c = 0; local_2c < local_10; local_2c = local_2c + 2) {
    local_38 = local_20;
    local_40 = local_20 + local_c;
    local_48 = local_18;
    local_50 = local_18 + local_c * 3;
    for (local_54 = local_c; 0 < local_54; local_54 = local_54 + -2) {
      local_58 = *local_28 - 0x80;
      local_5c = local_28[1] - 0x80;
      local_60 = local_5c * 0x5a;
      local_64 = local_5c * -0x2e + local_58 * -0x16;
      local_68 = local_58 * 0x71;
      local_6c = (uint)*local_38 * 0x40;
      local_78[2] = local_6c + local_60 >> 6;
      local_78[1] = 0;
      piVar1 = std::max<int>(local_78 + 2,local_78 + 1);
      local_78[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_78);
      *local_48 = (char)*piVar1;
      local_84[2] = local_6c + local_64 >> 6;
      local_84[1] = 0;
      piVar1 = std::max<int>(local_84 + 2,local_84 + 1);
      local_84[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_84);
      local_48[1] = (char)*piVar1;
      local_90[2] = local_6c + local_68 >> 6;
      local_90[1] = 0;
      piVar1 = std::max<int>(local_90 + 2,local_90 + 1);
      local_90[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_90);
      local_48[2] = (char)*piVar1;
      local_94 = (uint)local_38[1] * 0x40;
      local_a0[2] = local_94 + local_60 >> 6;
      local_a0[1] = 0;
      piVar1 = std::max<int>(local_a0 + 2,local_a0 + 1);
      local_a0[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_a0);
      local_48[3] = (char)*piVar1;
      local_ac[2] = local_94 + local_64 >> 6;
      local_ac[1] = 0;
      piVar1 = std::max<int>(local_ac + 2,local_ac + 1);
      local_ac[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_ac);
      local_48[4] = (char)*piVar1;
      local_b8[2] = local_94 + local_68 >> 6;
      local_b8[1] = 0;
      piVar1 = std::max<int>(local_b8 + 2,local_b8 + 1);
      local_b8[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_b8);
      local_48[5] = (char)*piVar1;
      local_bc = (uint)*local_40 * 0x40;
      local_c8[2] = local_bc + local_60 >> 6;
      local_c8[1] = 0;
      piVar1 = std::max<int>(local_c8 + 2,local_c8 + 1);
      local_c8[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_c8);
      *local_50 = (char)*piVar1;
      local_d4[2] = local_bc + local_64 >> 6;
      local_d4[1] = 0;
      piVar1 = std::max<int>(local_d4 + 2,local_d4 + 1);
      local_d4[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_d4);
      local_50[1] = (char)*piVar1;
      local_e0[2] = local_bc + local_68 >> 6;
      local_e0[1] = 0;
      piVar1 = std::max<int>(local_e0 + 2,local_e0 + 1);
      local_e0[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_e0);
      local_50[2] = (char)*piVar1;
      local_e4 = (uint)local_40[1] * 0x40;
      local_f0[2] = local_e4 + local_60 >> 6;
      local_f0[1] = 0;
      piVar1 = std::max<int>(local_f0 + 2,local_f0 + 1);
      local_f0[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_f0);
      local_50[3] = (char)*piVar1;
      local_fc[2] = local_e4 + local_64 >> 6;
      local_fc[1] = 0;
      piVar1 = std::max<int>(local_fc + 2,local_fc + 1);
      local_fc[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_fc);
      local_50[4] = (char)*piVar1;
      local_108[2] = local_e4 + local_68 >> 6;
      local_108[1] = 0;
      piVar1 = std::max<int>(local_108 + 2,local_108 + 1);
      local_108[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_108);
      local_50[5] = (char)*piVar1;
      local_38 = local_38 + 2;
      local_40 = local_40 + 2;
      local_28 = local_28 + 2;
      local_48 = local_48 + 6;
      local_50 = local_50 + 6;
    }
    local_20 = local_20 + (local_c << 1);
    local_18 = local_18 + local_c * 6;
  }
  return;
}

Assistant:

void yuv420sp2rgb_nv12(const unsigned char* yuv420sp, int w, int h, unsigned char* rgb)
{
    const unsigned char* yptr = yuv420sp;
    const unsigned char* uvptr = yuv420sp + w * h;

#if __ARM_NEON
    uint8x8_t _v128 = vdup_n_u8(128);
    int8x8_t _v90 = vdup_n_s8(90);
    int8x8_t _v46 = vdup_n_s8(46);
    int8x8_t _v22 = vdup_n_s8(22);
    int8x8_t _v113 = vdup_n_s8(113);
#endif // __ARM_NEON

    for (int y = 0; y < h; y += 2)
    {
        const unsigned char* yptr0 = yptr;
        const unsigned char* yptr1 = yptr + w;
        unsigned char* rgb0 = rgb;
        unsigned char* rgb1 = rgb + w * 3;

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn > 0; nn--)
        {
            int16x8_t _yy0 = vreinterpretq_s16_u16(vshll_n_u8(vld1_u8(yptr0), 6));
            int16x8_t _yy1 = vreinterpretq_s16_u16(vshll_n_u8(vld1_u8(yptr1), 6));

            int8x8_t _uuvv = vreinterpret_s8_u8(vsub_u8(vld1_u8(uvptr), _v128));
            int8x8x2_t _uuuuvvvv = vtrn_s8(_uuvv, _uuvv);
            int8x8_t _uu = _uuuuvvvv.val[0];
            int8x8_t _vv = _uuuuvvvv.val[1];

            int16x8_t _r0 = vmlal_s8(_yy0, _vv, _v90);
            int16x8_t _g0 = vmlsl_s8(_yy0, _vv, _v46);
            _g0 = vmlsl_s8(_g0, _uu, _v22);
            int16x8_t _b0 = vmlal_s8(_yy0, _uu, _v113);

            int16x8_t _r1 = vmlal_s8(_yy1, _vv, _v90);
            int16x8_t _g1 = vmlsl_s8(_yy1, _vv, _v46);
            _g1 = vmlsl_s8(_g1, _uu, _v22);
            int16x8_t _b1 = vmlal_s8(_yy1, _uu, _v113);

            uint8x8x3_t _rgb0;
            _rgb0.val[0] = vqshrun_n_s16(_r0, 6);
            _rgb0.val[1] = vqshrun_n_s16(_g0, 6);
            _rgb0.val[2] = vqshrun_n_s16(_b0, 6);

            uint8x8x3_t _rgb1;
            _rgb1.val[0] = vqshrun_n_s16(_r1, 6);
            _rgb1.val[1] = vqshrun_n_s16(_g1, 6);
            _rgb1.val[2] = vqshrun_n_s16(_b1, 6);

            vst3_u8(rgb0, _rgb0);
            vst3_u8(rgb1, _rgb1);

            yptr0 += 8;
            yptr1 += 8;
            uvptr += 8;
            rgb0 += 24;
            rgb1 += 24;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "0:                             \n"
                "pld        [%3, #128]          \n"
                "vld1.u8    {d2}, [%3]!         \n"
                "vsub.s8    d2, d2, %12         \n"
                "pld        [%1, #128]          \n"
                "vld1.u8    {d0}, [%1]!         \n"
                "pld        [%2, #128]          \n"
                "vld1.u8    {d1}, [%2]!         \n"
                "vshll.u8   q2, d0, #6          \n"
                "vorr       d3, d2, d2          \n"
                "vshll.u8   q3, d1, #6          \n"
                "vorr       q9, q2, q2          \n"
                "vtrn.s8    d2, d3              \n"
                "vorr       q11, q3, q3         \n"
                "vmlsl.s8   q9, d3, %14         \n"
                "vorr       q8, q2, q2          \n"
                "vmlsl.s8   q11, d3, %14        \n"
                "vorr       q10, q3, q3         \n"
                "vmlal.s8   q8, d3, %13         \n"
                "vmlal.s8   q2, d2, %16         \n"
                "vmlal.s8   q10, d3, %13        \n"
                "vmlsl.s8   q9, d2, %15         \n"
                "vmlal.s8   q3, d2, %16         \n"
                "vmlsl.s8   q11, d2, %15        \n"
                "vqshrun.s16 d24, q8, #6        \n"
                "vqshrun.s16 d26, q2, #6        \n"
                "vqshrun.s16 d4, q10, #6        \n"
                "vqshrun.s16 d25, q9, #6        \n"
                "vqshrun.s16 d6, q3, #6         \n"
                "vqshrun.s16 d5, q11, #6        \n"
                "subs       %0, #1              \n"
                "vst3.u8    {d24-d26}, [%4]!    \n"
                "vst3.u8    {d4-d6}, [%5]!      \n"
                "bne        0b                  \n"
                : "=r"(nn),    // %0
                "=r"(yptr0), // %1
                "=r"(yptr1), // %2
                "=r"(uvptr), // %3
                "=r"(rgb0),  // %4
                "=r"(rgb1)   // %5
                : "0"(nn),
                "1"(yptr0),
                "2"(yptr1),
                "3"(uvptr),
                "4"(rgb0),
                "5"(rgb1),
                "w"(_v128), // %12
                "w"(_v90),  // %13
                "w"(_v46),  // %14
                "w"(_v22),  // %15
                "w"(_v113)  // %16
                : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12", "d26");
        }
#endif // __aarch64__
#endif // __ARM_NEON

#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);
        for (; remain > 0; remain -= 2)
        {
            // R = 1.164 * yy + 1.596 * vv
            // G = 1.164 * yy - 0.813 * vv - 0.391 * uu
            // B = 1.164 * yy              + 2.018 * uu

            // R = Y + (1.370705 * (V-128))
            // G = Y - (0.698001 * (V-128)) - (0.337633 * (U-128))
            // B = Y + (1.732446 * (U-128))

            // R = ((Y << 6) + 87.72512 * (V-128)) >> 6
            // G = ((Y << 6) - 44.672064 * (V-128) - 21.608512 * (U-128)) >> 6
            // B = ((Y << 6) + 110.876544 * (U-128)) >> 6

            // R = ((Y << 6) + 90 * (V-128)) >> 6
            // G = ((Y << 6) - 46 * (V-128) - 22 * (U-128)) >> 6
            // B = ((Y << 6) + 113 * (U-128)) >> 6

            // R = (yy + 90 * vv) >> 6
            // G = (yy - 46 * vv - 22 * uu) >> 6
            // B = (yy + 113 * uu) >> 6

            int u = uvptr[0] - 128;
            int v = uvptr[1] - 128;

            int ruv = 90 * v;
            int guv = -46 * v + -22 * u;
            int buv = 113 * u;

            int y00 = yptr0[0] << 6;
            rgb0[0] = SATURATE_CAST_UCHAR((y00 + ruv) >> 6);
            rgb0[1] = SATURATE_CAST_UCHAR((y00 + guv) >> 6);
            rgb0[2] = SATURATE_CAST_UCHAR((y00 + buv) >> 6);

            int y01 = yptr0[1] << 6;
            rgb0[3] = SATURATE_CAST_UCHAR((y01 + ruv) >> 6);
            rgb0[4] = SATURATE_CAST_UCHAR((y01 + guv) >> 6);
            rgb0[5] = SATURATE_CAST_UCHAR((y01 + buv) >> 6);

            int y10 = yptr1[0] << 6;
            rgb1[0] = SATURATE_CAST_UCHAR((y10 + ruv) >> 6);
            rgb1[1] = SATURATE_CAST_UCHAR((y10 + guv) >> 6);
            rgb1[2] = SATURATE_CAST_UCHAR((y10 + buv) >> 6);

            int y11 = yptr1[1] << 6;
            rgb1[3] = SATURATE_CAST_UCHAR((y11 + ruv) >> 6);
            rgb1[4] = SATURATE_CAST_UCHAR((y11 + guv) >> 6);
            rgb1[5] = SATURATE_CAST_UCHAR((y11 + buv) >> 6);

            yptr0 += 2;
            yptr1 += 2;
            uvptr += 2;
            rgb0 += 6;
            rgb1 += 6;
        }
#undef SATURATE_CAST_UCHAR

        yptr += 2 * w;
        rgb += 2 * 3 * w;
    }
}